

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,char *list_file_name)

{
  bool bVar1;
  FILE *__stream;
  char *pcVar2;
  size_t __n;
  char **ppcVar3;
  ulong uVar4;
  CaptureSummary **cs;
  CaptureSummary *pCVar5;
  size_t i;
  char **file_name;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_258;
  ulong local_248;
  undefined8 local_240;
  char buffer [512];
  
  local_240 = this;
  __stream = (FILE *)ithi_file_open(list_file_name,"r");
  local_248 = 0x7f;
  local_258 = 0;
  file_name = (char **)0x0;
  uVar6 = 0;
LAB_00160d01:
  do {
    if (__stream == (FILE *)0x0) {
      return false;
    }
    pcVar2 = fgets(buffer,0x200,__stream);
    if (pcVar2 == (char *)0x0) {
      if (local_258 < 0x81) {
        bVar1 = Merge(local_240,local_258,file_name);
      }
      else {
        uVar4 = local_258 + 0x7f >> 7;
        cs = (CaptureSummary **)operator_new__(uVar4 * 8);
        bVar1 = true;
        uVar6 = 0;
        for (uVar7 = 0; (bVar1 != false && (uVar7 < uVar4)); uVar7 = uVar7 + 1) {
          pCVar5 = (CaptureSummary *)operator_new(0x20);
          pCVar5->capture_version = 0xcd;
          (pCVar5->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pCVar5->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pCVar5->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar8 = uVar6 + 0x80;
          if (local_258 <= uVar6 + 0x80) {
            uVar8 = local_258;
          }
          cs[uVar7] = pCVar5;
          bVar1 = Merge(pCVar5,uVar8 - uVar6,file_name + uVar6);
          uVar6 = uVar8;
        }
        if (bVar1 == false) {
          bVar1 = false;
        }
        else {
          bVar1 = Merge(local_240,uVar4,cs);
        }
        for (uVar6 = 0; local_248 >> 7 != uVar6; uVar6 = uVar6 + 1) {
          pCVar5 = cs[uVar6];
          if (pCVar5 != (CaptureSummary *)0x0) {
            ~CaptureSummary(pCVar5);
            operator_delete(pCVar5);
            cs[uVar6] = (CaptureSummary *)0x0;
          }
        }
        operator_delete__(cs);
      }
      if (file_name != (char **)0x0) {
        for (uVar6 = 0; local_258 != uVar6; uVar6 = uVar6 + 1) {
          if (file_name[uVar6] != (char *)0x0) {
            operator_delete__(file_name[uVar6]);
          }
          file_name[uVar6] = (char *)0x0;
        }
        operator_delete__(file_name);
      }
      if (__stream == (FILE *)0x0) {
        return bVar1;
      }
      fclose(__stream);
      return bVar1;
    }
    __n = strlen(buffer);
    while( true ) {
      if (__n == 0) goto LAB_00160d01;
      if ((0x20 < (ulong)(byte)buffer[__n - 1]) ||
         ((0x100002600U >> ((ulong)(byte)buffer[__n - 1] & 0x3f) & 1) == 0)) break;
      buffer[__n] = '\0';
      __n = __n - 1;
    }
    ppcVar3 = file_name;
    if (uVar6 <= local_258) {
      uVar7 = uVar6 * 2;
      if (uVar6 == 0) {
        uVar7 = 0x200;
      }
      ppcVar3 = (char **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        ppcVar3[uVar4] = file_name[uVar4];
        file_name[uVar4] = (char *)0x0;
      }
      for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        ppcVar3[uVar6] = (char *)0x0;
      }
      uVar6 = uVar7;
      if (file_name != (char **)0x0) {
        operator_delete__(file_name);
      }
    }
    file_name = ppcVar3;
    pcVar2 = (char *)operator_new__(__n + 1);
    file_name[local_258] = pcVar2;
    memcpy(pcVar2,buffer,__n);
    file_name[local_258][__n] = '\0';
    local_258 = local_258 + 1;
    local_248 = local_248 + 1;
  } while( true );
}

Assistant:

bool CaptureSummary::Merge(char const * list_file_name)
{
    size_t nb_alloc = 0;
    char ** file_list = NULL;
    size_t nb_files = 0;
    FILE* F;
    char buffer[512];
    const size_t batch_size = 128;

    /* Open the list file */
    bool ret;
    F = ithi_file_open(list_file_name, "r");
    ret = (F != NULL);

    /* Read each file name and add it to the list */
    while (ret && fgets(buffer, sizeof(buffer), F) != NULL) {
        /* Clean up the end of the buffer */
        size_t len = strlen(buffer);

        while (len > 0 && (buffer[len-1] == ' ' || buffer[len-1] == '\t' || buffer[len-1] == '\r' || buffer[len-1] == '\n')) {
            buffer[len--] = 0;
        }

        if (len == 0)
        {
            continue;
        }

        /* Allocate memory if necessary */
        if (nb_files >= nb_alloc) {
            size_t new_len = (nb_alloc == 0) ? 512 : 2 * nb_alloc;
            char ** new_list = new char*[new_len];

            if (new_list == NULL) {
                ret = false;
            }
            else
            {
                size_t i = 0;
                while (i < nb_alloc){
                    new_list[i] = file_list[i];
                    file_list[i++] = NULL;
                }
                while (i < new_len) {
                    new_list[i++] = NULL;
                }

                if (file_list != NULL) {
                    delete[] file_list;
                }
                file_list = new_list;
                nb_alloc = new_len;
            }
        }

        /* Record the name */
        if (ret)
        {
            file_list[nb_files] = new char[len + 1];
            if (file_list[nb_files] == NULL)
            {
                ret = false;
            }
            else
            {
                memcpy(file_list[nb_files], buffer, len);
                file_list[nb_files][len] = 0;
                nb_files++;
            }
        }
    }


    /* Merge the list */
    if (ret)
    {
        /* Create intermediate merge files if there are more than 100 summaries */
        if (nb_files > batch_size) {
            size_t nb_compiled = 0;
            size_t nb_intermediate_summaries = (nb_files + batch_size - 1) / batch_size;
            size_t nb_created = 0;
            CaptureSummary** intermediate_list = new  CaptureSummary * [nb_intermediate_summaries];

            if (intermediate_list == NULL) {
                ret = false;
            }
            else {
                for (size_t i = 0; ret && i < nb_intermediate_summaries; i++) {
                    intermediate_list[i] = new CaptureSummary();
                    if (intermediate_list[i] == NULL) {
                        ret = false;
                        for (size_t j = nb_created; j < nb_intermediate_summaries; j++) {
                            intermediate_list[j] = NULL;
                        }
                    }
                    else {
                        nb_created++;
                        size_t first_file = nb_compiled;
                        nb_compiled += batch_size;
                        if (nb_compiled > nb_files) {
                            nb_compiled = nb_files;
                        }
                        ret = intermediate_list[i]->Merge(nb_compiled - first_file, (char const**)(file_list + first_file));
                    }
                }

                if (ret) {
                    /* Merge all the summaries */
                    ret = Merge(nb_intermediate_summaries, intermediate_list);
                }
                /* Clean up all the intermediate summaries */
                for (size_t i = 0; i < nb_intermediate_summaries; i++) {
                    if (intermediate_list[i] != NULL) {
                        delete intermediate_list[i];
                        intermediate_list[i] = NULL;
                    }
                }
                delete[] intermediate_list;
            }
        }
        else {
            ret = Merge(nb_files, (char const**)file_list);
        }
    }

    /* Clean up */
    if (file_list != NULL)
    {
        for (size_t i = 0; i < nb_files; i++)
        {
            delete[] file_list[i];
            file_list[i] = NULL;
        }

        delete[] file_list;
    }

    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}